

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildReg1Float32x4_1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  RealCount *pRVar1;
  SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *pSVar2;
  code *pcVar3;
  bool bVar4;
  RegOpnd *this_00;
  StackSym *sym;
  SymOpnd *this_01;
  Instr *instr;
  Type pSVar5;
  undefined4 *puVar6;
  undefined6 in_register_00000032;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TySimd128F4);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0x145) {
    sym = StackSym::NewArgSlotSym((ArgSlot)dstRegSlot,this->m_func,TySimd128F4);
    sym->field_0x19 = sym->field_0x19 | 0x10;
    if (0xffff < dstRegSlot) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0xfc7,"((0))","Arg count too big...");
      if (bVar4) {
        *puVar6 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00505330:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    this_01 = IR::SymOpnd::New(&sym->super_Sym,TySimd128F4,this->m_func);
    IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x4000);
    instr = IR::Instr::New(ArgOut_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
    AddInstr(this,instr,offset);
    pSVar2 = this->m_argStack;
    pSVar5 = (Type)new<Memory::ArenaAllocator>
                             (0x10,(pSVar2->
                                   super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                                   allocator,0x366bee);
    pSVar5[1].next = (Type)instr;
    pSVar5->next = (pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar5;
    pRVar1 = &(pSVar2->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
    pRVar1->count = pRVar1->count + 1;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xfd4,"((0))","UNREACHED");
    if (!bVar4) goto LAB_00505330;
    *puVar6 = 0;
  }
  return;
}

Assistant:

void IRBuilderAsmJs::BuildReg1Float32x4_1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG2)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TySimd128F4);
    srcOpnd->SetValueType(ValueType::Simd);

    IR::Instr * instr = nullptr;
    IR::Opnd * dstOpnd = nullptr;
    StackSym * symDst = nullptr;

    if (newOpcode == Js::OpCodeAsmJs::Simd128_I_ArgOut_F4)
    {
        symDst = StackSym::NewArgSlotSym((uint16)dstRegSlot, m_func, TySimd128F4);
        symDst->m_allocated = true;
        if ((uint16)(dstRegSlot) != (dstRegSlot))
        {
            AssertMsg(UNREACHED, "Arg count too big...");
            Fatal();
        }
        dstOpnd = IR::SymOpnd::New(symDst, TySimd128F4, m_func);
        dstOpnd->SetValueType(ValueType::Simd);

        instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
        AddInstr(instr, offset);

        m_argStack->Push(instr);
    }
    else
    {
        Assert(UNREACHED);
    }
}